

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O0

int x509_get_crl_ext(uchar **p,uchar *end,mbedtls_x509_buf *ext)

{
  int iVar1;
  size_t local_38;
  size_t len;
  mbedtls_x509_buf *pmStack_28;
  int ret;
  mbedtls_x509_buf *ext_local;
  uchar *end_local;
  uchar **p_local;
  
  local_38 = 0;
  pmStack_28 = ext;
  ext_local = (mbedtls_x509_buf *)end;
  end_local = (uchar *)p;
  p_local._4_4_ = mbedtls_x509_get_ext(p,end,ext,0);
  if (p_local._4_4_ == 0) {
    while (len._4_4_ = 0, *(mbedtls_x509_buf **)end_local < ext_local) {
      iVar1 = mbedtls_asn1_get_tag((uchar **)end_local,(uchar *)ext_local,&local_38,0x30);
      if (iVar1 != 0) {
        return iVar1 + -0x2500;
      }
      *(size_t *)end_local = local_38 + *(long *)end_local;
    }
    if (*(mbedtls_x509_buf **)end_local == ext_local) {
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = -0x2566;
    }
  }
  else if (p_local._4_4_ == -0x62) {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_crl_ext( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_x509_buf *ext )
{
    int ret;
    size_t len = 0;

    /* Get explicit tag */
    if( ( ret = mbedtls_x509_get_ext( p, end, ext, 0) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    while( *p < end )
    {
        if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
                MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        *p += len;
    }

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}